

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppnet_base.cpp
# Opt level: O3

void __thiscall cppnet::CppNetBase::Init(CppNetBase *this,uint32_t thread_num)

{
  uint32_t uVar1;
  RangeRandom *this_00;
  uint32_t uVar2;
  shared_ptr<cppnet::Dispatcher> dispatcher;
  sigset_t set;
  undefined1 local_d1;
  __shared_ptr<cppnet::CppNetBase,(__gnu_cxx::_Lock_policy)2> local_d0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  __shared_ptr<cppnet::Dispatcher,(__gnu_cxx::_Lock_policy)2> local_c0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  sigset_t local_b0;
  
  uVar1 = GetCpuNum();
  uVar2 = uVar1;
  if (thread_num < uVar1 * 2) {
    uVar2 = thread_num;
  }
  if (thread_num == 0) {
    uVar2 = uVar1;
  }
  this_00 = (RangeRandom *)operator_new(8);
  RangeRandom::RangeRandom(this_00,0,uVar2 - 1);
  std::__uniq_ptr_impl<cppnet::RangeRandom,_std::default_delete<cppnet::RangeRandom>_>::reset
            ((__uniq_ptr_impl<cppnet::RangeRandom,_std::default_delete<cppnet::RangeRandom>_> *)
             &this->_random,this_00);
  sigprocmask(2,(sigset_t *)0x0,&local_b0);
  sigaddset(&local_b0,0xd);
  sigprocmask(2,&local_b0,(sigset_t *)0x0);
  if (uVar2 != 0) {
    do {
      std::__shared_ptr<cppnet::CppNetBase,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<cppnet::CppNetBase,void>
                (local_d0,(__weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2> *)this);
      std::__shared_ptr<cppnet::Dispatcher,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<cppnet::Dispatcher>,std::shared_ptr<cppnet::CppNetBase>>
                (local_c0,(allocator<cppnet::Dispatcher> *)&local_d1,
                 (shared_ptr<cppnet::CppNetBase> *)local_d0);
      if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
      }
      std::
      vector<std::shared_ptr<cppnet::Dispatcher>,_std::allocator<std::shared_ptr<cppnet::Dispatcher>_>_>
      ::push_back(&this->_dispatchers,(value_type *)local_c0);
      if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
      }
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void CppNetBase::Init(uint32_t thread_num) {
    uint32_t cpus = GetCpuNum();
    if (thread_num == 0 || thread_num >= cpus * 2) {
        thread_num = cpus;
    }
    _random = std::unique_ptr<RangeRandom>(new RangeRandom(0, thread_num - 1));

#ifndef __win__
    //Disable  SIGPIPE signal
    sigset_t set;
    sigprocmask(SIG_SETMASK, NULL, &set);
    sigaddset(&set, SIGPIPE);
    sigprocmask(SIG_SETMASK, &set, NULL);
#endif

    for (uint32_t i = 0; i < thread_num; i++) {
        auto dispatcher = std::make_shared<Dispatcher>(shared_from_this());
        _dispatchers.push_back(dispatcher);
    }
}